

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O3

spv_result_t spvtools::val::FunctionPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  size_t sVar3;
  pointer pIVar4;
  pointer ppVar5;
  ValidationState_t *this;
  EnumSet<spv::Capability> *this_00;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint32_t id;
  AddressingModel AVar9;
  StorageClass SVar10;
  uint uVar11;
  uint id_00;
  uint32_t uVar12;
  undefined4 *puVar13;
  __normal_iterator<const_spv::Op_*,_std::vector<spv::Op,_std::allocator<spv::Op>_>_> _Var14;
  Instruction *b;
  Instruction *pIVar15;
  Instruction *pIVar16;
  long lVar17;
  spv_result_t sVar18;
  undefined4 *puVar19;
  char *pcVar20;
  _Alloc_hider _Var21;
  undefined4 *puVar22;
  ulong uVar23;
  pointer pIVar24;
  pointer ppVar25;
  byte bVar26;
  string local_270;
  uint local_24c;
  ValidationState_t *local_248;
  Instruction *local_240;
  uint local_234;
  string local_230;
  EnumSet<spv::Capability> *local_210;
  DiagnosticStream local_208;
  
  bVar26 = 0;
  uVar1 = (inst->inst_).opcode;
  if (uVar1 < 0x39) {
    if (uVar1 == 0x36) {
      uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar16 = ValidationState_t::FindDef(_,uVar11);
      if ((pIVar16 != (Instruction *)0x0) && ((pIVar16->inst_).opcode == 0x21)) {
        id = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
        if (id == (inst->inst_).type_id) {
          local_248 = _;
          puVar13 = (undefined4 *)operator_new(0x44);
          puVar19 = &DAT_007ad38c;
          puVar22 = puVar13;
          for (lVar17 = 0x11; lVar17 != 0; lVar17 = lVar17 + -1) {
            *puVar22 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
            puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
          }
          ppVar25 = (inst->uses_).
                    super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar5 = (inst->uses_).
                   super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sVar18 = SPV_SUCCESS;
          if (ppVar25 != ppVar5) {
            local_240 = inst;
            do {
              pIVar16 = ppVar25->first;
              local_208._0_4_ = ZEXT24((pIVar16->inst_).opcode);
              _Var14 = std::
                       __find_if<__gnu_cxx::__normal_iterator<spv::Op_const*,std::vector<spv::Op,std::allocator<spv::Op>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                                 (puVar13,puVar13 + 0x11,&local_208);
              if (((_Var14._M_current == puVar13 + 0x11) &&
                  (bVar6 = Instruction::IsNonSemantic(pIVar16), !bVar6)) &&
                 (bVar6 = Instruction::IsDebugInfo(pIVar16), this = local_248, !bVar6)) {
                ValidationState_t::diag(&local_208,local_248,SPV_ERROR_INVALID_ID,pIVar16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Invalid use of function result id ",0x22);
                ValidationState_t::getIdName_abi_cxx11_
                          (&local_270,this,(local_240->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != &local_270.field_2) {
                  operator_delete(local_270._M_dataplus._M_p,
                                  local_270.field_2._M_allocated_capacity + 1);
                }
                DiagnosticStream::~DiagnosticStream(&local_208);
                sVar18 = local_208.error_;
                break;
              }
              ppVar25 = ppVar25 + 1;
            } while (ppVar25 != ppVar5);
          }
          operator_delete(puVar13,0x44);
          goto LAB_0066f7f2;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"OpFunction Result Type <id> ",0x1c);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar20 = " does not match the Function Type\'s return type <id> ";
        lVar17 = 0x35;
        goto LAB_0066f867;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunction Function Type <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      pcVar20 = " is not a function type.";
      lVar17 = 0x18;
LAB_0066f3ed:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar20,lVar17);
      sVar18 = local_208.error_;
      goto LAB_0066f404;
    }
    if (uVar1 != 0x37) {
      return SPV_SUCCESS;
    }
    sVar3 = inst->line_num_;
    if (sVar3 - 1 == 0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar20 = "Function parameter cannot be the first instruction.";
      lVar17 = 0x33;
LAB_0066f7dc:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar20,lVar17);
      sVar18 = local_208.error_;
    }
    else {
      pIVar4 = (_->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = sVar3 - 2;
      if (lVar17 == 0) {
        uVar23 = 0;
        pIVar16 = pIVar4 + (sVar3 - 1);
      }
      else {
        pIVar24 = pIVar4 + (sVar3 - 2);
        uVar23 = 0;
        do {
          uVar2 = (pIVar24->inst_).opcode;
          pIVar16 = pIVar24;
          if (uVar2 == 0x36) break;
          uVar23 = uVar23 + (uVar2 == 0x37);
          pIVar24 = pIVar24 + -1;
          lVar17 = lVar17 + -1;
          pIVar16 = pIVar4 + 1;
        } while (lVar17 != 0);
      }
      if ((pIVar16->inst_).opcode != 0x36) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar20 = "Function parameter must be preceded by a function.";
        lVar17 = 0x32;
        goto LAB_0066f7dc;
      }
      uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,3);
      pIVar15 = ValidationState_t::FindDef(_,uVar11);
      if (pIVar15 == (Instruction *)0x0) {
LAB_0066f7cb:
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,pIVar16);
        pcVar20 = "Missing function type definition.";
        lVar17 = 0x21;
        goto LAB_0066f7dc;
      }
      if (uVar23 < ((long)(pIVar15->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pIVar15->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) - 3U) {
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar15,uVar23 + 2);
        pIVar16 = ValidationState_t::FindDef(_,uVar11);
        if ((pIVar16 != (Instruction *)0x0) && ((inst->inst_).type_id == (pIVar16->inst_).result_id)
           ) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"OpFunctionParameter Result Type <id> ",0x25);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar20 = " does not match the OpTypeFunction parameter type of the same index.";
        lVar17 = 0x44;
        goto LAB_0066f3ed;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Too many OpFunctionParameters for ",0x22);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": expected ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," based on the function\'s type",0x1d);
      sVar18 = local_208.error_;
    }
  }
  else {
    if (uVar1 == 0x39) {
      uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar16 = ValidationState_t::FindDef(_,uVar11);
      if ((pIVar16 == (Instruction *)0x0) || ((pIVar16->inst_).opcode != 0x36)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar20 = "OpFunctionCall Function <id> ";
        lVar17 = 0x1d;
        goto LAB_0066f3b8;
      }
      pIVar15 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
      if ((pIVar15 != (Instruction *)0x0) && ((pIVar15->inst_).result_id == (inst->inst_).type_id))
      {
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,3);
        pIVar15 = ValidationState_t::FindDef(_,uVar11);
        pIVar16 = inst;
        if ((pIVar15 == (Instruction *)0x0) || ((pIVar15->inst_).opcode != 0x21)) goto LAB_0066f7cb;
        if ((long)(pIVar15->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pIVar15->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2 ==
            ((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) + -1) {
          if ((ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(inst->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x31) {
            return SPV_SUCCESS;
          }
          local_210 = &_->module_capabilities_;
          lVar17 = 0;
          local_240 = pIVar15;
          while( true ) {
            local_248 = (ValidationState_t *)lVar17;
            uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,lVar17 + 3);
            pIVar16 = ValidationState_t::FindDef(_,uVar11);
            if (pIVar16 == (Instruction *)0x0) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Missing argument ",0x11);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
              pcVar20 = " definition.";
              lVar17 = 0xc;
              goto LAB_0066f7dc;
            }
            pIVar15 = ValidationState_t::FindDef(_,(pIVar16->inst_).type_id);
            if (pIVar15 == (Instruction *)0x0) break;
            local_24c = uVar11;
            local_234 = Instruction::GetOperandAs<unsigned_int>(local_240,lVar17 + 2);
            b = ValidationState_t::FindDef(_,local_234);
            if ((b == (Instruction *)0x0) ||
               (((pIVar15->inst_).result_id != (b->inst_).result_id &&
                ((_->options_->before_hlsl_legalization != true ||
                 (bVar6 = anon_unknown_2::DoPointeesLogicallyMatch(pIVar15,b,_), !bVar6)))))) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"OpFunctionCall Argument <id> ",0x1d);
              ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_24c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
              ValidationState_t::getIdName_abi_cxx11_(&local_230,_,local_234);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_230._M_dataplus._M_p,local_230._M_string_length
                        );
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"s parameter type.",0x11);
              goto LAB_0066f8ab;
            }
            AVar9 = ValidationState_t::addressing_model(_);
            if ((AVar9 == AddressingModelLogical) &&
               (((uVar2 = (b->inst_).opcode, uVar2 == 0x1141 || (uVar2 == 0x20)) &&
                (_->options_->relax_logical_pointer == false)))) {
              SVar10 = Instruction::GetOperandAs<spv::StorageClass>(b,1);
              this_00 = local_210;
              if (StorageBuffer < SVar10) {
LAB_0066fcfd:
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,"Invalid storage class for pointer operand ",0x2a);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_24c);
                _Var21._M_p = local_270._M_dataplus._M_p;
                goto LAB_0066fb47;
              }
              if ((0x4d1U >> (SVar10 & 0x1f) & 1) == 0) {
                if (SVar10 != StorageBuffer) goto LAB_0066fcfd;
                if ((_->features_).variable_pointers == false) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"StorageBuffer pointer operand ",0x1e);
                  ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_24c);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_270._M_dataplus._M_p,
                             local_270._M_string_length);
                  pcVar20 = " requires a variable pointers capability";
                  lVar17 = 0x28;
                  goto LAB_0066f3ed;
                }
              }
              uVar2 = (pIVar16->inst_).opcode;
              if (((uVar2 != 0x37) && (uVar2 != 0x3b)) && (uVar2 != 0x1142)) {
                bVar6 = EnumSet<spv::Capability>::contains
                                  (local_210,CapabilityVariablePointersStorageBuffer);
                bVar7 = EnumSet<spv::Capability>::contains(this_00,CapabilityVariablePointers);
                if (((SVar10 != StorageClassUniformConstant) &&
                    (SVar10 != StorageClassWorkgroup || !bVar7)) &&
                   ((SVar10 != StorageBuffer || !bVar6 &&
                    (_->options_->before_hlsl_legalization == false)))) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Pointer operand ",0x10);
                  ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_24c);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_270._M_dataplus._M_p,
                             local_270._M_string_length);
                  pcVar20 = " must be a memory object declaration";
                  lVar17 = 0x24;
                  goto LAB_0066f3ed;
                }
              }
            }
            uVar23 = lVar17 + 4;
            lVar17 = (long)local_248 + 1;
            if ((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar23) {
              return SPV_SUCCESS;
            }
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Missing argument ",0x11);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          pcVar20 = " type definition.";
          lVar17 = 0x11;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar20 = 
          "OpFunctionCall Function <id>\'s parameter count does not match the argument count.";
          lVar17 = 0x51;
        }
        goto LAB_0066f7dc;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunctionCall Result Type <id> ",0x20);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
      ValidationState_t::getIdName_abi_cxx11_(&local_230,_,(pIVar15->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
      pcVar20 = "s return type.";
      lVar17 = 0xe;
    }
    else {
      if (uVar1 != 0x14f9) {
        return SPV_SUCCESS;
      }
      uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar16 = ValidationState_t::FindDef(_,uVar11);
      if ((pIVar16 == (Instruction *)0x0) || ((pIVar16->inst_).opcode != 0x36)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar20 = "OpCooperativeMatrixPerElementOpNV Function <id> ";
        lVar17 = 0x30;
LAB_0066f3b8:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar20,lVar17);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar20 = " is not a function.";
        lVar17 = 0x13;
        goto LAB_0066f3ed;
      }
      uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar15 = ValidationState_t::FindDef(_,uVar11);
      id = (pIVar15->inst_).type_id;
      bVar6 = ValidationState_t::IsCooperativeMatrixKHRType(_,id);
      if (!bVar6) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"OpCooperativeMatrixPerElementOpNV Matrix <id> ",0x2e);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar20 = " is not a cooperative matrix.";
        lVar17 = 0x1d;
        goto LAB_0066f3ed;
      }
      uVar11 = Instruction::GetOperandAs<unsigned_int>(inst,0);
      if (id == uVar11) {
        pIVar15 = ValidationState_t::FindDef(_,id);
        id = Instruction::GetOperandAs<unsigned_int>(pIVar15,1);
        uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,3);
        pIVar16 = ValidationState_t::FindDef(_,uVar11);
        uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
        if (uVar8 == id) {
          if ((ulong)((long)(pIVar16->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pIVar16->operands_).
                           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                           ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpCooperativeMatrixPerElementOpNV function type <id> "
                       ,0x35);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            pcVar20 = " must have a least three parameters.";
            lVar17 = 0x24;
          }
          else {
            uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar16,2);
            uVar8 = Instruction::GetOperandAs<unsigned_int>(pIVar16,3);
            id_00 = Instruction::GetOperandAs<unsigned_int>(pIVar16,4);
            bVar6 = ValidationState_t::IsIntScalarType(_,uVar11);
            if ((bVar6) && (uVar12 = ValidationState_t::GetBitWidth(_,uVar11), uVar12 == 0x20)) {
              bVar6 = ValidationState_t::IsIntScalarType(_,uVar8);
              if ((bVar6) && (uVar12 = ValidationState_t::GetBitWidth(_,uVar8), uVar12 == 0x20)) {
                if (id_00 == id) {
                  return SPV_SUCCESS;
                }
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           "OpCooperativeMatrixPerElementOpNV function type third parameter type <id> "
                           ,0x4a);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,id_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                pcVar20 = " must match matrix component type.";
                lVar17 = 0x22;
                goto LAB_0066f3ed;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "OpCooperativeMatrixPerElementOpNV function type second parameter type <id> "
                         ,0x4b);
              ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length
                        );
              local_270._M_string_length = 0x1a;
              _Var21._M_p = " must be a 32-bit integer.";
LAB_0066fb47:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,_Var21._M_p,local_270._M_string_length);
              sVar18 = local_208.error_;
              goto LAB_0066f404;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,
                       "OpCooperativeMatrixPerElementOpNV function type first parameter type <id> ",
                       0x4a);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            pcVar20 = " must be a 32-bit integer.";
            lVar17 = 0x1a;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar20,lVar17);
          sVar18 = local_208.error_;
          goto LAB_0066f404;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,
                   "OpCooperativeMatrixPerElementOpNV function return type <id> ",0x3c);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar20 = " must match matrix component type <id> ";
        lVar17 = 0x27;
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"OpCooperativeMatrixPerElementOpNV Result Type <id> ",0x33)
        ;
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar20 = " must match matrix type <id> ";
        lVar17 = 0x1d;
      }
LAB_0066f867:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar20,lVar17);
      ValidationState_t::getIdName_abi_cxx11_(&local_230,_,id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_230._M_dataplus._M_p,local_230._M_string_length);
      pcVar20 = ".";
      lVar17 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar20,lVar17);
LAB_0066f8ab:
    sVar18 = local_208.error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
LAB_0066f404:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_0066f7f2:
  if (sVar18 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar18;
}

Assistant:

spv_result_t FunctionPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpFunction:
      if (auto error = ValidateFunction(_, inst)) return error;
      break;
    case spv::Op::OpFunctionParameter:
      if (auto error = ValidateFunctionParameter(_, inst)) return error;
      break;
    case spv::Op::OpFunctionCall:
      if (auto error = ValidateFunctionCall(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixPerElementOpNV:
      if (auto error = ValidateCooperativeMatrixPerElementOp(_, inst))
        return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}